

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void __thiscall ImGuiInputTextState::OnKeyPressed(ImGuiInputTextState *this,int key)

{
  STB_TexteditState *state;
  byte bVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  int iVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  ImFont *pIVar7;
  float fVar8;
  StbUndoRecord *pSVar9;
  ImGuiContext *pIVar10;
  bool bVar11;
  short sVar12;
  ushort uVar13;
  int temp;
  int iVar14;
  ulong uVar15;
  ImStb *pIVar16;
  long lVar17;
  ImWchar *pIVar18;
  int n_1;
  uint uVar19;
  int iVar20;
  long lVar21;
  unsigned_short *puVar22;
  int temp_1;
  int iVar23;
  ImGuiInputTextState *str;
  int *piVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  uint uVar29;
  ImFont *in_R8;
  float *pfVar30;
  uint uVar31;
  int iVar32;
  bool bVar33;
  float fVar34;
  float fVar35;
  ImWchar ch;
  int *local_68;
  ImWchar *local_58;
  float local_4c;
  ImWchar local_48 [6];
  uint local_3c;
  uint local_38;
  uint local_34;
  
  state = &this->Stb;
  bVar1 = (this->Stb).single_line;
LAB_0021bcf0:
  uVar31 = (uint)bVar1;
  switch(key) {
  case 0x200000:
    goto switchD_0021bd02_caseD_200000;
  case 0x200001:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      (this->Stb).cursor = (this->Stb).cursor + 1;
      iVar14 = this->CurLenW;
    }
    else {
      ImStb::stb_textedit_move_to_last(this,state);
      iVar14 = this->CurLenW;
      iVar32 = (this->Stb).select_start;
      iVar27 = (this->Stb).select_end;
      if (iVar32 != iVar27) {
        if (iVar14 < iVar32) {
          (this->Stb).select_start = iVar14;
          iVar32 = iVar14;
        }
        if (iVar14 < iVar27) {
          (this->Stb).select_end = iVar14;
          iVar27 = iVar14;
        }
        if (iVar32 == iVar27) {
          state->cursor = iVar32;
        }
      }
    }
    if (iVar14 < state->cursor) goto LAB_0021c806;
    goto LAB_0021cb88;
  case 0x200002:
  case 0x20000e:
switchD_0021bd02_caseD_200002:
    uVar25 = key & 0x400000;
    if ((key & 0xffbfffffU) == 0x20000e) {
      iVar14 = (this->Stb).row_count_per_page;
    }
    else {
      if (bVar1 != 0) {
        key = uVar25 | 0x200000;
        goto LAB_0021bcf0;
      }
      iVar14 = 1;
    }
    uVar29 = (this->Stb).select_start;
    str = (ImGuiInputTextState *)(ulong)uVar29;
    uVar19 = (this->Stb).select_end;
    if (uVar25 == 0) {
      if (uVar29 == uVar19) {
        str = (ImGuiInputTextState *)(ulong)(uint)state->cursor;
      }
      else {
        if ((int)uVar19 < (int)uVar29) {
          (this->Stb).select_start = uVar19;
          str = (ImGuiInputTextState *)(ulong)uVar19;
        }
        (this->Stb).cursor = (int)str;
        (this->Stb).select_end = (int)str;
        (this->Stb).has_preferred_x = '\0';
      }
LAB_0021c04d:
      uVar26 = this->CurLenW;
    }
    else {
      if (uVar29 == uVar19) {
        uVar29 = (this->Stb).cursor;
        str = (ImGuiInputTextState *)(ulong)uVar29;
        (this->Stb).select_end = uVar29;
        (this->Stb).select_start = uVar29;
        goto LAB_0021c04d;
      }
      (this->Stb).cursor = uVar19;
      uVar26 = this->CurLenW;
      if ((int)uVar26 < (int)uVar29) {
        (this->Stb).select_start = uVar26;
        str = (ImGuiInputTextState *)(ulong)uVar26;
      }
      uVar29 = uVar19;
      if ((int)uVar26 < (int)uVar19) {
        (this->Stb).select_end = uVar26;
        uVar29 = uVar26;
      }
      if ((uint)str == uVar29) {
        state->cursor = (uint)str;
      }
      else {
        str = (ImGuiInputTextState *)(ulong)uVar19;
      }
    }
    if ((int)uVar26 < (int)str) {
      state->cursor = uVar26;
      str = (ImGuiInputTextState *)(ulong)uVar26;
    }
    ImStb::stb_textedit_find_charpos((ImStb *)local_48,(StbFindState *)this,str,uVar31,(int)in_R8);
    if (iVar14 < 1) goto LAB_0021cb8c;
    pIVar16 = (ImStb *)&(this->Stb).preferred_x;
    if ((this->Stb).has_preferred_x == '\0') {
      pIVar16 = (ImStb *)local_48;
    }
    fVar34 = *(float *)pIVar16;
    iVar32 = 0;
    uVar31 = local_34;
    goto LAB_0021c097;
  case 0x200003:
  case 0x20000f:
switchD_0021bd02_caseD_200003:
    uVar25 = key & 0x400000;
    if ((key & 0xffbfffffU) == 0x20000f) {
      iVar14 = (this->Stb).row_count_per_page;
LAB_0021bd82:
      uVar31 = (this->Stb).select_start;
      uVar29 = (this->Stb).select_end;
      if (uVar25 == 0) {
        if (uVar31 == uVar29) goto LAB_0021bdb7;
        ImStb::stb_textedit_move_to_last(this,state);
        uVar31 = (this->Stb).select_start;
        uVar29 = (this->Stb).select_end;
LAB_0021be78:
        uVar19 = this->CurLenW;
        if (uVar31 != uVar29) {
          if ((int)uVar19 < (int)uVar31) {
            (this->Stb).select_start = uVar19;
            uVar31 = uVar19;
          }
          if ((int)uVar19 < (int)uVar29) {
            (this->Stb).select_end = uVar19;
            uVar29 = uVar19;
          }
          if (uVar31 == uVar29) {
            state->cursor = uVar31;
          }
        }
      }
      else {
        if (uVar31 != uVar29) {
          state->cursor = uVar29;
          goto LAB_0021be78;
        }
        iVar32 = (this->Stb).cursor;
        (this->Stb).select_end = iVar32;
        (this->Stb).select_start = iVar32;
LAB_0021bdb7:
        uVar19 = this->CurLenW;
      }
      local_68 = &this->CurLenW;
      uVar31 = state->cursor;
      if ((int)uVar19 < state->cursor) {
        state->cursor = uVar19;
        uVar31 = uVar19;
      }
      ImStb::stb_textedit_find_charpos
                ((ImStb *)local_48,(StbFindState *)this,(ImGuiInputTextState *)(ulong)uVar31,
                 (uint)(this->Stb).single_line,(int)in_R8);
      if (iVar14 < 1) goto LAB_0021cb8c;
      uVar15 = (ulong)local_38;
      pIVar16 = (ImStb *)&(this->Stb).preferred_x;
      if ((this->Stb).has_preferred_x == '\0') {
        pIVar16 = (ImStb *)local_48;
      }
      local_4c = *(float *)pIVar16;
      iVar32 = 0;
      uVar31 = local_3c;
      goto LAB_0021bef1;
    }
    if (uVar31 == 0) {
      iVar14 = 1;
      goto LAB_0021bd82;
    }
    key = uVar25 | 0x200001;
    goto LAB_0021bcf0;
  case 0x200004:
    uVar25 = this->CurLenW;
    uVar29 = (this->Stb).select_start;
    uVar19 = (this->Stb).select_end;
    uVar26 = uVar29;
    if (uVar29 != uVar19) {
      if ((int)uVar25 < (int)uVar29) {
        (this->Stb).select_start = uVar25;
        uVar29 = uVar25;
      }
      if ((int)uVar25 < (int)uVar19) {
        (this->Stb).select_end = uVar25;
        uVar19 = uVar25;
      }
      uVar26 = uVar19;
      if (uVar29 == uVar19) {
        state->cursor = uVar29;
        uVar26 = uVar29;
      }
    }
    uVar19 = state->cursor;
    if ((int)uVar25 < state->cursor) {
      state->cursor = uVar25;
      uVar19 = uVar25;
    }
    if (uVar29 != uVar26) {
      uVar19 = uVar29;
      if ((int)uVar26 < (int)uVar29) {
        (this->Stb).select_start = uVar26;
        uVar19 = uVar26;
      }
      (this->Stb).cursor = uVar19;
      (this->Stb).select_end = uVar19;
      (this->Stb).has_preferred_x = '\0';
    }
    if (uVar31 != 0) {
      state->cursor = 0;
      goto LAB_0021cb88;
    }
    if ((int)uVar19 < 1) goto LAB_0021cb88;
    puVar22 = (this->TextW).Data;
    uVar15 = (ulong)uVar19;
    goto LAB_0021c8a8;
  case 0x200005:
    iVar14 = this->CurLenW;
    iVar32 = (this->Stb).select_start;
    iVar27 = (this->Stb).select_end;
    iVar23 = iVar32;
    if (iVar32 != iVar27) {
      if (iVar14 < iVar32) {
        (this->Stb).select_start = iVar14;
        iVar32 = iVar14;
      }
      if (iVar14 < iVar27) {
        (this->Stb).select_end = iVar14;
        iVar27 = iVar14;
      }
      iVar23 = iVar27;
      if (iVar32 == iVar27) {
        state->cursor = iVar32;
        iVar23 = iVar32;
      }
    }
    iVar27 = state->cursor;
    if (iVar14 < state->cursor) {
      state->cursor = iVar14;
      iVar27 = iVar14;
    }
    if (iVar32 != iVar23) {
      iVar27 = iVar32;
      if (iVar23 < iVar32) {
        (this->Stb).select_start = iVar23;
        iVar27 = iVar23;
      }
      (this->Stb).cursor = iVar27;
      (this->Stb).select_end = iVar27;
      (this->Stb).has_preferred_x = '\0';
    }
    if (uVar31 != 0) {
      state->cursor = iVar14;
      goto LAB_0021cb88;
    }
    if (iVar14 <= iVar27) goto LAB_0021cb88;
    puVar22 = (this->TextW).Data + iVar27;
    goto LAB_0021c8e6;
  case 0x200006:
    (this->Stb).select_end = 0;
    (this->Stb).cursor = 0;
    (this->Stb).select_start = 0;
    goto LAB_0021cb88;
  case 0x200007:
    (this->Stb).cursor = this->CurLenW;
    (this->Stb).select_start = 0;
    (this->Stb).select_end = 0;
    goto LAB_0021cb88;
  case 0x200008:
switchD_0021bd02_caseD_200008:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar14 = (this->Stb).cursor;
      if (iVar14 < this->CurLenW) {
        ImStb::stb_textedit_delete(this,state,iVar14,1);
      }
      goto LAB_0021cb88;
    }
    break;
  case 0x200009:
switchD_0021bd02_caseD_200009:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar14 = this->CurLenW;
      iVar32 = (this->Stb).cursor;
      if (iVar14 < iVar32) {
        state->cursor = iVar14;
        iVar32 = iVar14;
      }
      if (0 < iVar32) {
        ImStb::stb_textedit_delete(this,state,iVar32 + -1,1);
        (this->Stb).cursor = (this->Stb).cursor + -1;
      }
      goto LAB_0021cb88;
    }
    break;
  case 0x20000a:
    lVar21 = (long)(this->Stb).undostate.undo_point;
    if (lVar21 == 0) goto LAB_0021cb88;
    iVar14 = (this->Stb).undostate.undo_rec[lVar21 + -1].where;
    iVar32 = (this->Stb).undostate.undo_rec[lVar21 + -1].insert_length;
    uVar31 = (this->Stb).undostate.undo_rec[lVar21 + -1].delete_length;
    lVar17 = (long)(this->Stb).undostate.redo_point;
    iVar27 = (this->Stb).undostate.undo_rec[lVar21 + -1].char_storage;
    (this->Stb).undostate.undo_rec[lVar17 + -1].char_storage = -1;
    (this->Stb).undostate.undo_rec[lVar17 + -1].insert_length = uVar31;
    (this->Stb).undostate.undo_rec[lVar17 + -1].delete_length = iVar32;
    (this->Stb).undostate.undo_rec[lVar17 + -1].where = iVar14;
    if ((ulong)uVar31 == 0) goto LAB_0021cac0;
    iVar23 = (this->Stb).undostate.undo_char_point;
    if ((int)(iVar23 + uVar31) < 999) {
      iVar20 = (this->Stb).undostate.redo_char_point;
      uVar13 = (this->Stb).undostate.redo_point;
      uVar25 = (uint)uVar13;
      if (iVar20 < (int)(iVar23 + uVar31)) goto LAB_0021c997;
      goto LAB_0021ca64;
    }
    (this->Stb).undostate.undo_rec[lVar17 + -1].insert_length = 0;
    goto LAB_0021caad;
  case 0x20000b:
    lVar21 = (long)(this->Stb).undostate.redo_point;
    if (lVar21 != 99) {
      sVar12 = (this->Stb).undostate.undo_point;
      iVar14 = (this->Stb).undostate.undo_rec[lVar21].where;
      iVar32 = (this->Stb).undostate.undo_rec[lVar21].insert_length;
      iVar27 = (this->Stb).undostate.undo_rec[lVar21].delete_length;
      iVar23 = (this->Stb).undostate.undo_rec[lVar21].char_storage;
      (this->Stb).undostate.undo_rec[sVar12].delete_length = iVar32;
      (this->Stb).undostate.undo_rec[sVar12].insert_length = iVar27;
      (this->Stb).undostate.undo_rec[sVar12].where = iVar14;
      (this->Stb).undostate.undo_rec[sVar12].char_storage = -1;
      if (iVar27 != 0) {
        iVar4 = (this->Stb).undostate.undo_char_point;
        iVar20 = iVar4 + iVar27;
        if ((this->Stb).undostate.redo_char_point < iVar20) {
          pSVar9 = (this->Stb).undostate.undo_rec + sVar12;
          pSVar9->insert_length = 0;
          pSVar9->delete_length = 0;
        }
        else {
          (this->Stb).undostate.undo_rec[sVar12].char_storage = iVar4;
          (this->Stb).undostate.undo_char_point = iVar20;
          if (0 < (this->Stb).undostate.undo_rec[sVar12].insert_length) {
            lVar21 = 0;
            do {
              (this->Stb).undostate.undo_char
              [(this->Stb).undostate.undo_rec[sVar12].char_storage + lVar21] =
                   (this->TextW).Data[(this->Stb).undostate.undo_rec[sVar12].where + lVar21];
              lVar21 = lVar21 + 1;
            } while ((int)lVar21 < (this->Stb).undostate.undo_rec[sVar12].insert_length);
          }
        }
        ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar14,iVar27);
      }
      if (iVar32 != 0) {
        ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar14,(this->Stb).undostate.undo_char + iVar23,iVar32)
        ;
        piVar24 = &(this->Stb).undostate.redo_char_point;
        *piVar24 = *piVar24 + iVar32;
      }
      (this->Stb).cursor = iVar32 + iVar14;
      uVar3 = (this->Stb).undostate.undo_point;
      uVar6 = (this->Stb).undostate.redo_point;
      (this->Stb).undostate.undo_point = uVar3 + 1;
      (this->Stb).undostate.redo_point = uVar6 + 1;
    }
    goto LAB_0021cb88;
  case 0x20000c:
    iVar32 = (this->Stb).select_start;
    iVar14 = (this->Stb).select_end;
    bVar33 = SBORROW4(iVar32,iVar14);
    iVar27 = iVar32 - iVar14;
    bVar11 = iVar32 == iVar14;
    if (!bVar11) goto LAB_0021c639;
    uVar31 = state->cursor;
    uVar25 = (int)uVar31 >> 0x1f & uVar31;
    goto LAB_0021c61c;
  case 0x20000d:
    if ((this->Stb).select_start != (this->Stb).select_end) {
      ImStb::stb_textedit_move_to_last(this,state);
      goto LAB_0021cb8c;
    }
    uVar31 = ImStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,(this->Stb).cursor);
    goto LAB_0021c917;
  default:
    switch(key) {
    case 0x600000:
      iVar14 = this->CurLenW;
      iVar27 = (this->Stb).select_start;
      iVar32 = (this->Stb).select_end;
      if (iVar27 == iVar32) {
        iVar27 = state->cursor;
LAB_0021c7ac:
        iVar32 = iVar14;
        if (iVar27 < iVar14) {
          iVar32 = iVar27;
        }
        (this->Stb).select_end = iVar32;
        (this->Stb).select_start = iVar32;
      }
      else {
        if (iVar14 < iVar27) {
          (this->Stb).select_start = iVar14;
          iVar27 = iVar14;
        }
        if (iVar14 < iVar32) {
          (this->Stb).select_end = iVar14;
          iVar32 = iVar14;
        }
        if (iVar27 == iVar32) goto LAB_0021c7ac;
      }
      if (0 < iVar32) {
        iVar32 = iVar32 + -1;
        (this->Stb).select_end = iVar32;
      }
      (this->Stb).cursor = iVar32;
      goto LAB_0021cb88;
    case 0x600001:
      iVar14 = (this->Stb).select_start;
      iVar32 = (this->Stb).select_end;
      if (iVar14 == iVar32) {
        iVar14 = (this->Stb).cursor;
        (this->Stb).select_start = iVar14;
        iVar32 = iVar14;
      }
      iVar27 = iVar32 + 1;
      (this->Stb).select_end = iVar27;
      if (iVar14 != iVar27) {
        iVar23 = this->CurLenW;
        if (iVar23 < iVar14) {
          (this->Stb).select_start = iVar23;
        }
        iVar14 = iVar27;
        if (iVar23 <= iVar32) {
          (this->Stb).select_end = iVar23;
          iVar14 = iVar23;
        }
      }
      (this->Stb).cursor = iVar14;
      goto LAB_0021cb88;
    case 0x600002:
    case 0x60000e:
      goto switchD_0021bd02_caseD_200002;
    case 0x600003:
    case 0x60000f:
      goto switchD_0021bd02_caseD_200003;
    case 0x600004:
      uVar25 = this->CurLenW;
      uVar29 = (this->Stb).select_start;
      uVar19 = (this->Stb).select_end;
      uVar26 = uVar29;
      if (uVar29 != uVar19) {
        if ((int)uVar25 < (int)uVar29) {
          (this->Stb).select_start = uVar25;
          uVar29 = uVar25;
        }
        if ((int)uVar25 < (int)uVar19) {
          (this->Stb).select_end = uVar25;
          uVar19 = uVar25;
        }
        uVar26 = uVar19;
        if (uVar29 == uVar19) {
          state->cursor = uVar29;
          uVar26 = uVar29;
        }
      }
      uVar19 = state->cursor;
      if ((int)uVar25 < state->cursor) {
        state->cursor = uVar25;
        uVar19 = uVar25;
      }
      if (uVar29 == uVar26) {
        (this->Stb).select_end = uVar19;
        (this->Stb).select_start = uVar19;
        uVar26 = uVar19;
      }
      else {
        state->cursor = uVar26;
      }
      uVar15 = (ulong)uVar26;
      if (uVar31 != 0) {
        state->cursor = 0;
        goto LAB_0021c771;
      }
      if (((int)uVar26 < 1) ||
         (puVar22 = (this->TextW).Data, uVar28 = uVar15, puVar22[uVar15 - 1] == 10))
      goto LAB_0021c773;
      goto LAB_0021c875;
    case 0x600005:
      iVar14 = this->CurLenW;
      iVar32 = (this->Stb).select_start;
      iVar27 = (this->Stb).select_end;
      iVar23 = iVar32;
      if (iVar32 != iVar27) {
        if (iVar14 < iVar32) {
          (this->Stb).select_start = iVar14;
          iVar32 = iVar14;
        }
        if (iVar14 < iVar27) {
          (this->Stb).select_end = iVar14;
          iVar27 = iVar14;
        }
        iVar23 = iVar27;
        if (iVar32 == iVar27) {
          state->cursor = iVar32;
          iVar23 = iVar32;
        }
      }
      iVar27 = state->cursor;
      if (iVar14 < state->cursor) {
        state->cursor = iVar14;
        iVar27 = iVar14;
      }
      if (iVar32 == iVar23) {
        (this->Stb).select_end = iVar27;
        (this->Stb).select_start = iVar27;
        iVar23 = iVar27;
      }
      else {
        state->cursor = iVar23;
      }
      if (uVar31 != 0) {
        state->cursor = iVar14;
        iVar32 = iVar14;
        goto LAB_0021c853;
      }
      iVar32 = iVar23;
      if (iVar14 <= iVar23) goto LAB_0021c853;
      puVar22 = (this->TextW).Data;
      if (puVar22[iVar23] == 10) goto LAB_0021c853;
      puVar22 = puVar22 + iVar23;
      goto LAB_0021c83b;
    case 0x600006:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        (this->Stb).select_start = (this->Stb).cursor;
      }
      iVar14 = 0;
      break;
    case 0x600007:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        (this->Stb).select_start = (this->Stb).cursor;
      }
      iVar14 = this->CurLenW;
      break;
    case 0x600008:
      goto switchD_0021bd02_caseD_200008;
    case 0x600009:
      goto switchD_0021bd02_caseD_200009;
    default:
      uVar31 = 0;
      if (key < 0x200000) {
        uVar31 = key;
      }
      if (((int)uVar31 < 1) || (local_48[0] = (ImWchar)uVar31, uVar31 == 10 && bVar1 != 0))
      goto LAB_0021cb8c;
      if (((this->Stb).insert_mode == '\0') || ((this->Stb).select_start != (this->Stb).select_end))
      {
LAB_0021c92a:
        ImStb::stb_textedit_delete_selection(this,state);
        bVar11 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,local_48,1);
        if (!bVar11) goto LAB_0021cb8c;
        ImStb::stb_text_createundo(&(this->Stb).undostate,(this->Stb).cursor,0,1);
      }
      else {
        iVar14 = (this->Stb).cursor;
        if (this->CurLenW <= iVar14) goto LAB_0021c92a;
        pIVar18 = ImStb::stb_text_createundo(&(this->Stb).undostate,iVar14,1,1);
        if (pIVar18 != (ImWchar *)0x0) {
          *pIVar18 = (this->TextW).Data[iVar14];
        }
        ImStb::STB_TEXTEDIT_DELETECHARS(this,(this->Stb).cursor,1);
        bVar11 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,local_48,1);
        if (!bVar11) goto LAB_0021cb8c;
      }
      (this->Stb).cursor = (this->Stb).cursor + 1;
      goto LAB_0021cb88;
    case 0x60000c:
      uVar31 = (this->Stb).cursor;
      uVar25 = (this->Stb).select_start;
      if (uVar25 == (this->Stb).select_end) {
        (this->Stb).select_end = uVar31;
        (this->Stb).select_start = uVar31;
        uVar25 = uVar31;
      }
      uVar29 = (int)uVar31 >> 0x1f & uVar31;
      goto LAB_0021c294;
    case 0x60000d:
      iVar14 = (this->Stb).cursor;
      if ((this->Stb).select_start == (this->Stb).select_end) {
        (this->Stb).select_end = iVar14;
        (this->Stb).select_start = iVar14;
      }
      iVar27 = ImStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,iVar14);
      (this->Stb).cursor = iVar27;
      (this->Stb).select_end = iVar27;
      iVar14 = this->CurLenW;
      iVar32 = (this->Stb).select_start;
      if (iVar32 != iVar27) {
        if (iVar14 < iVar32) {
          (this->Stb).select_start = iVar14;
          iVar32 = iVar14;
        }
        iVar23 = iVar27;
        if (iVar14 < iVar27) {
          (this->Stb).select_end = iVar14;
          iVar23 = iVar14;
        }
        if (iVar32 == iVar23) {
          state->cursor = iVar32;
          iVar27 = iVar32;
        }
      }
      if (iVar14 < iVar27) {
        state->cursor = iVar14;
      }
      goto LAB_0021cb8c;
    }
    (this->Stb).select_end = iVar14;
    (this->Stb).cursor = iVar14;
    goto LAB_0021cb88;
  }
  ImStb::stb_textedit_delete_selection(this,state);
  goto LAB_0021cb88;
  while( true ) {
    uVar31 = uVar31 - 1;
    iVar14 = ImStb::is_word_boundary_from_right(this,uVar31);
    uVar19 = uVar31;
    if (iVar14 != 0) break;
LAB_0021c294:
    uVar19 = uVar29 - 1;
    if ((int)uVar31 < 1) break;
  }
  uVar31 = 0;
  if (0 < (int)uVar19) {
    uVar31 = uVar19;
  }
  (this->Stb).cursor = uVar31;
  (this->Stb).select_end = uVar31;
  uVar29 = this->CurLenW;
  if (uVar25 != uVar31) {
    uVar19 = uVar25;
    if ((int)uVar29 < (int)uVar25) {
      (this->Stb).select_start = uVar29;
      uVar19 = uVar29;
    }
    uVar26 = uVar31;
    if ((int)uVar29 < (int)uVar31) {
      (this->Stb).select_end = uVar29;
      uVar26 = uVar29;
    }
    uVar25 = uVar31;
    if (uVar19 == uVar26) {
      state->cursor = uVar19;
      uVar25 = uVar19;
    }
  }
  if ((int)uVar29 < (int)uVar25) {
    state->cursor = uVar29;
  }
  goto LAB_0021cb8c;
  while (iVar32 = iVar23, *puVar22 != 10) {
LAB_0021c83b:
    iVar23 = iVar23 + 1;
    puVar22 = puVar22 + 1;
    state->cursor = iVar23;
    iVar32 = iVar14;
    if (iVar14 == iVar23) break;
  }
LAB_0021c853:
  (this->Stb).select_end = iVar32;
  goto LAB_0021cb88;
  while (uVar15 = uVar28 - 1, lVar21 = uVar28 - 2, uVar28 = uVar15, puVar22[lVar21] != 10) {
LAB_0021c875:
    state->cursor = (int)uVar28 + -1;
    if (uVar28 < 2) goto LAB_0021c771;
  }
LAB_0021c773:
  (this->Stb).select_end = (int)uVar15;
  goto LAB_0021cb88;
LAB_0021c771:
  uVar15 = 0;
  goto LAB_0021c773;
  while( true ) {
    uVar31 = uVar31 - 1;
    iVar14 = ImStb::is_word_boundary_from_right(this,uVar31);
    uVar29 = uVar31;
    if (iVar14 != 0) break;
LAB_0021c61c:
    uVar29 = uVar25 - 1;
    if ((int)uVar31 < 1) break;
  }
  uVar31 = 0;
  if (0 < (int)uVar29) {
    uVar31 = uVar29;
  }
LAB_0021c917:
  (this->Stb).cursor = uVar31;
  ImStb::stb_textedit_clamp((ImGuiInputTextState *)(ulong)(uint)this->CurLenW,state);
  goto LAB_0021cb8c;
  while( true ) {
    if (sVar12 < 99) {
      if (-1 < (this->Stb).undostate.undo_rec[0x62].char_storage) {
        iVar23 = (this->Stb).undostate.undo_rec[0x62].insert_length;
        iVar20 = iVar20 + iVar23;
        (this->Stb).undostate.redo_char_point = iVar20;
        pIVar18 = (this->Stb).undostate.undo_char + iVar20;
        memmove(pIVar18,pIVar18 + -(long)iVar23,(long)(999 - iVar20) * 2);
        sVar12 = (this->Stb).undostate.redo_point;
        lVar21 = (long)sVar12;
        if (lVar21 < 0x62) {
          lVar17 = lVar21 + -0x62;
          piVar24 = &(this->Stb).undostate.undo_rec[lVar21].char_storage;
          do {
            if (-1 < *piVar24) {
              *piVar24 = *piVar24 + iVar23;
            }
            piVar24 = piVar24 + 4;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 0);
        }
      }
      lVar21 = (long)sVar12;
      memmove((this->Stb).undostate.undo_rec + lVar21 + 1,(this->Stb).undostate.undo_rec + lVar21,
              lVar21 * -0x10 + 0x620);
      iVar23 = (this->Stb).undostate.undo_char_point;
      uVar25 = *(int *)&(this->Stb).undostate.redo_point + 1;
      (this->Stb).undostate.redo_point = (short)uVar25;
      iVar20 = (this->Stb).undostate.redo_char_point;
    }
    uVar13 = (ushort)uVar25;
    if ((int)(uVar31 + iVar23) <= iVar20) break;
LAB_0021c997:
    sVar12 = (short)uVar25;
    if (sVar12 == 99) goto LAB_0021cb88;
  }
LAB_0021ca64:
  (this->Stb).undostate.undo_rec[(long)(short)uVar13 + -1].char_storage = iVar20 - uVar31;
  (this->Stb).undostate.redo_char_point = iVar20 - uVar31;
  if (0 < (int)uVar31) {
    uVar15 = 0;
    do {
      (this->Stb).undostate.undo_char
      [(long)(this->Stb).undostate.undo_rec[(long)(short)uVar13 + -1].char_storage + uVar15] =
           (this->TextW).Data[(long)iVar14 + uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar31 != uVar15);
  }
LAB_0021caad:
  ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar14,uVar31);
LAB_0021cac0:
  if (iVar32 != 0) {
    ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar14,(this->Stb).undostate.undo_char + iVar27,iVar32);
    piVar24 = &(this->Stb).undostate.undo_char_point;
    *piVar24 = *piVar24 - iVar32;
  }
  (this->Stb).cursor = iVar32 + iVar14;
  uVar2 = (this->Stb).undostate.undo_point;
  uVar5 = (this->Stb).undostate.redo_point;
  (this->Stb).undostate.undo_point = uVar2 + -1;
  (this->Stb).undostate.redo_point = uVar5 + -1;
  goto LAB_0021cb88;
  while( true ) {
    state->cursor = iVar27;
    puVar22 = puVar22 + 1;
    if (iVar27 == iVar14) break;
LAB_0021c8e6:
    iVar27 = iVar27 + 1;
    if (*puVar22 == 10) break;
  }
  goto LAB_0021cb88;
LAB_0021bef1:
  do {
    if ((int)uVar15 == 0) break;
    uVar31 = uVar31 + (int)uVar15;
    puVar22 = (this->TextW).Data;
    if (puVar22[(long)(int)uVar31 + -1] != 10) break;
    state->cursor = uVar31;
    local_58 = (ImWchar *)0x0;
    InputTextCalcTextSizeW
              (puVar22 + (int)uVar31,puVar22 + *local_68,&local_58,(ImVec2 *)0x1,SUB81(in_R8,0));
    pIVar10 = GImGui;
    uVar15 = (ulong)((long)local_58 - (long)(puVar22 + (int)uVar31)) >> 1;
    if (0 < (int)(uint)uVar15) {
      puVar22 = (this->TextW).Data;
      iVar27 = (this->Stb).cursor;
      fVar34 = 0.0;
      uVar28 = 0;
      while( true ) {
        uVar13 = puVar22[(long)(int)uVar31 + uVar28];
        in_R8 = (ImFont *)(ulong)uVar13;
        if (uVar13 == 10) break;
        pIVar7 = pIVar10->Font;
        pfVar30 = &pIVar7->FallbackAdvanceX;
        if ((int)(uint)uVar13 < (pIVar7->IndexAdvanceX).Size) {
          pfVar30 = (float *)((ulong)((uint)uVar13 * 4) + (long)(pIVar7->IndexAdvanceX).Data);
        }
        fVar35 = (pIVar10->FontSize / pIVar7->FontSize) * *pfVar30;
        if (((fVar35 == -1.0) && (!NAN(fVar35))) || (fVar34 = fVar34 + fVar35, local_4c < fVar34))
        break;
        uVar29 = iVar27 + 1 + (int)uVar28;
        in_R8 = (ImFont *)(ulong)uVar29;
        state->cursor = uVar29;
        uVar28 = uVar28 + 1;
        if (((uint)uVar15 & 0x7fffffff) == uVar28) break;
      }
    }
    iVar27 = this->CurLenW;
    iVar23 = (this->Stb).select_start;
    iVar20 = (this->Stb).select_end;
    if (iVar23 != iVar20) {
      if (iVar27 < iVar23) {
        (this->Stb).select_start = iVar27;
        iVar23 = iVar27;
      }
      if (iVar27 < iVar20) {
        (this->Stb).select_end = iVar27;
        iVar20 = iVar27;
      }
      if (iVar23 == iVar20) {
        state->cursor = iVar23;
      }
    }
    iVar23 = state->cursor;
    if (iVar27 < state->cursor) {
      state->cursor = iVar27;
      iVar23 = iVar27;
    }
    (this->Stb).has_preferred_x = '\x01';
    (this->Stb).preferred_x = local_4c;
    if (uVar25 != 0) {
      (this->Stb).select_end = iVar23;
    }
    iVar32 = iVar32 + 1;
  } while (iVar32 != iVar14);
  goto LAB_0021cb8c;
LAB_0021c097:
  do {
    if (uVar31 == local_3c) break;
    (this->Stb).cursor = uVar31;
    puVar22 = (this->TextW).Data;
    local_58 = (ImWchar *)0x0;
    pIVar18 = puVar22 + (int)uVar31;
    InputTextCalcTextSizeW(pIVar18,puVar22 + this->CurLenW,&local_58,(ImVec2 *)0x1,SUB81(in_R8,0));
    pIVar10 = GImGui;
    uVar29 = (uint)((ulong)((long)local_58 - (long)pIVar18) >> 1);
    if (0 < (int)uVar29) {
      puVar22 = (this->TextW).Data;
      iVar27 = (this->Stb).cursor;
      fVar35 = 0.0;
      uVar15 = 0;
      while (uVar13 = puVar22[(long)(int)uVar31 + uVar15], uVar13 != 10) {
        in_R8 = pIVar10->Font;
        pfVar30 = &in_R8->FallbackAdvanceX;
        if ((int)(uint)uVar13 < (in_R8->IndexAdvanceX).Size) {
          pfVar30 = (float *)((ulong)((uint)uVar13 * 4) + (long)(in_R8->IndexAdvanceX).Data);
        }
        fVar8 = (pIVar10->FontSize / in_R8->FontSize) * *pfVar30;
        if (((fVar8 == -1.0) && (!NAN(fVar8))) || (fVar35 = fVar35 + fVar8, fVar34 < fVar35)) break;
        state->cursor = iVar27 + 1 + (int)uVar15;
        uVar15 = uVar15 + 1;
        if ((uVar29 & 0x7fffffff) == uVar15) break;
      }
    }
    iVar27 = this->CurLenW;
    iVar23 = (this->Stb).select_start;
    iVar20 = (this->Stb).select_end;
    if (iVar23 != iVar20) {
      if (iVar27 < iVar23) {
        (this->Stb).select_start = iVar27;
        iVar23 = iVar27;
      }
      if (iVar27 < iVar20) {
        (this->Stb).select_end = iVar27;
        iVar20 = iVar27;
      }
      if (iVar23 == iVar20) {
        state->cursor = iVar23;
      }
    }
    iVar23 = state->cursor;
    if (iVar27 < state->cursor) {
      state->cursor = iVar27;
      iVar23 = iVar27;
    }
    (this->Stb).has_preferred_x = '\x01';
    (this->Stb).preferred_x = fVar34;
    if (uVar25 != 0) {
      (this->Stb).select_end = iVar23;
    }
    uVar15 = (ulong)(uVar31 - 1);
    if ((int)uVar31 < 1) {
      uVar15 = 0;
    }
    uVar19 = (uint)uVar15;
    uVar29 = uVar19 + 1;
    do {
      uVar26 = (int)uVar19 >> 0x1f & uVar19;
      if ((int)uVar15 < 1) break;
      uVar29 = uVar29 - 1;
      lVar21 = uVar15 - 1;
      uVar15 = uVar15 - 1;
      uVar26 = uVar29;
    } while ((this->TextW).Data[lVar21] != 10);
    iVar32 = iVar32 + 1;
    local_3c = uVar31;
    uVar31 = uVar26;
  } while (iVar32 != iVar14);
  goto LAB_0021cb8c;
switchD_0021bd02_caseD_200000:
  iVar32 = (this->Stb).select_start;
  iVar14 = (this->Stb).select_end;
  bVar33 = SBORROW4(iVar32,iVar14);
  iVar27 = iVar32 - iVar14;
  bVar11 = iVar32 == iVar14;
  if (!bVar11) {
LAB_0021c639:
    if (!bVar11 && bVar33 == iVar27 < 0) {
      (this->Stb).select_start = iVar14;
      iVar32 = iVar14;
    }
    (this->Stb).cursor = iVar32;
    goto LAB_0021c853;
  }
  if (0 < state->cursor) {
    iVar14 = state->cursor + -1;
LAB_0021c806:
    state->cursor = iVar14;
  }
  goto LAB_0021cb88;
  while( true ) {
    state->cursor = (int)uVar15 + -1;
    bVar11 = uVar15 < 2;
    uVar15 = uVar15 - 1;
    if (bVar11) break;
LAB_0021c8a8:
    if (puVar22[uVar15 - 1] == 10) break;
  }
LAB_0021cb88:
  (this->Stb).has_preferred_x = '\0';
LAB_0021cb8c:
  this->CursorFollow = true;
  this->CursorAnim = -0.3;
  return;
}

Assistant:

void ImGuiInputTextState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &Stb, key);
    CursorFollow = true;
    CursorAnimReset();
}